

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O3

size_t shuff_compress(uint8_t *out_u8,size_t out_size_u8,uint32_t *input_u32,size_t input_size)

{
  uint32_t *puVar1;
  ulong uVar2;
  uint64_t *freq;
  uint64_t *syms;
  uint32_t *puVar3;
  uint64_t uVar4;
  ulong *puVar5;
  size_t srcSize;
  size_t sVar6;
  uint8_t *out_size_u8_00;
  undefined4 *extraout_RDX;
  uint uVar7;
  ulong uVar8;
  uint8_t *out_ptr;
  char cVar9;
  ulong *puVar10;
  bit_io_t local_58;
  uint32_t *in_ptr;
  
  local_58.bytes_written = 0;
  local_58.buff_btg = 0x40;
  out_size_u8_00 = (uint8_t *)input_size;
  local_58.init_out_u8 = out_u8;
  local_58.out_u64 = (uint64_t *)out_u8;
  freq = (uint64_t *)shuff_allocate(0x40000002);
  syms = (uint64_t *)shuff_allocate(0x40000002);
  puVar1 = input_u32 + input_size;
  out_ptr = (uint8_t *)0x0;
  puVar3 = input_u32;
  if (0 < (long)input_size) {
    do {
      uVar7 = *puVar3 + 1;
      in_ptr = (uint32_t *)(ulong)uVar7;
      if (0x8000000 < uVar7) {
        shuff_compress();
        srcSize = vbyte::encode(in_ptr,out_size_u8,out_ptr,(size_t)out_size_u8_00,(uint8_t *)0x0);
        *extraout_RDX = (int)srcSize;
        sVar6 = FSE_compress(extraout_RDX + 1,(size_t)(out_size_u8_00 + -4),out_ptr,srcSize);
        if (sVar6 == 0) {
          *extraout_RDX = 0;
          memcpy(extraout_RDX + 1,out_ptr,srcSize);
          sVar6 = srcSize;
        }
        return sVar6 + 4;
      }
      out_size_u8_00 = (uint8_t *)(ulong)uVar7;
      if (out_ptr <= out_size_u8_00) {
        out_ptr = out_size_u8_00;
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 < puVar1);
  }
  uVar4 = shuff_one_pass_freq_count(input_u32,input_size,freq,syms,(uint64_t)out_ptr);
  shuff_build_codes(&local_58,syms,freq,uVar4);
  puVar5 = local_58.out_u64;
  uVar4 = local_58.buff_btg;
  puVar10 = local_58.out_u64;
  if (0 < (long)input_size) {
    do {
      uVar2 = freq[*input_u32 + 1];
      cVar9 = (char)uVar2;
      uVar8 = (syms[*input_u32 + 1] - *(long *)(&DAT_0019f918 + uVar2 * 8)) +
              *(long *)(&DAT_0019f518 + uVar2 * 8);
      uVar4 = local_58.buff_btg - (long)cVar9;
      if (local_58.buff_btg < (ulong)(long)cVar9 || uVar4 == 0) {
        puVar10 = puVar5 + 1;
        uVar4 = uVar4 + 0x40;
        puVar5[1] = uVar8;
        uVar8 = uVar8 >> ((ulong)(uint)((int)cVar9 - (int)local_58.buff_btg) & 0x3f) |
                *puVar5 << (local_58.buff_btg & 0x3f);
      }
      else {
        uVar8 = *puVar5 << (uVar2 & 0x3f) | uVar8;
        puVar10 = puVar5;
      }
      input_u32 = input_u32 + 1;
      *puVar5 = uVar8;
      puVar5 = puVar10;
      local_58.buff_btg = uVar4;
    } while (input_u32 < puVar1);
  }
  local_58.buff_btg = uVar4;
  free(freq);
  free(syms);
  if (uVar4 != 0x40) {
    *puVar10 = *puVar10 << ((byte)uVar4 & 0x3f);
  }
  return (long)puVar10 - (long)local_58.init_out_u8;
}

Assistant:

inline size_t shuff_compress(uint8_t* out_u8, size_t out_size_u8,
    const uint32_t* input_u32, size_t input_size)
{
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    bit_io_t bio;
    SHUFF_START_OUTPUT(&bio, out_u8);

    const uint32_t* up;
    uint64_t n;
    uint64_t max_symbol, temp;

    uint64_t* freqs
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL + 2);
    uint64_t* syms
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL + 2);

    /* find max_symbol and check range*/
    max_symbol = 0;
    for (up = input_u32; up < input_u32 + input_size; up++) {
        if (*up + 1 > max_symbol)
            max_symbol = *up + 1;
        SHUFF_CHECK_SYMBOL_RANGE(*up + 1);
    }

    n = shuff_one_pass_freq_count(
        input_u32, input_size, freqs, syms, max_symbol);

    shuff_build_codes(&bio, syms, freqs, n);

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = SHUFF_BYTES_WRITTEN(&bio);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    for (up = input_u32; up < input_u32 + input_size; up++)
        shuff_output(&bio, *up + 1, syms, freqs);

    free(freqs);
    free(syms);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes
        = SHUFF_BYTES_WRITTEN(&bio) - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return SHUFF_FINISH_OUTPUT(&bio);
}